

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadPoseVertices(OgreBinarySerializer *this,Pose *pose)

{
  StreamReader<false,_false> *this_00;
  int8_t *piVar1;
  unsigned_short uVar2;
  uint uVar3;
  mapped_type *pmVar4;
  int iVar5;
  MemoryStreamReader *this_01;
  bool bVar6;
  bool bVar7;
  Vertex v;
  uint local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  this_00 = this->m_reader;
  if (*(int *)&this_00->end != *(int *)&this_00->current) {
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_00);
    uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar3;
    this_01 = this->m_reader;
    bVar6 = *(int *)&this_01->end == *(int *)&this_01->current;
    if ((uVar2 == 0xc111) && (*(int *)&this_01->end != *(int *)&this_01->current)) {
      do {
        uStack_48 = 0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0;
        uStack_38 = 0;
        uStack_34 = 0;
        local_4c = StreamReader<false,_false>::Get<unsigned_int>(this_01);
        piVar1 = this->m_reader->current;
        StreamReader<false,_false>::SetPtr(this->m_reader,piVar1 + 0xc);
        uStack_40 = *(undefined4 *)(piVar1 + 8);
        uStack_48 = (undefined4)*(undefined8 *)piVar1;
        uStack_44 = (undefined4)((ulong)*(undefined8 *)piVar1 >> 0x20);
        if (pose->hasNormals == true) {
          piVar1 = this->m_reader->current;
          StreamReader<false,_false>::SetPtr(this->m_reader,piVar1 + 0xc);
          uStack_34 = *(undefined4 *)(piVar1 + 8);
          uStack_3c = (undefined4)*(undefined8 *)piVar1;
          uStack_38 = (undefined4)((ulong)*(undefined8 *)piVar1 >> 0x20);
        }
        pmVar4 = std::
                 map<unsigned_int,_Assimp::Ogre::Pose::Vertex,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::Ogre::Pose::Vertex>_>_>
                 ::operator[](&pose->vertices,&local_4c);
        *(ulong *)&(pmVar4->offset).z = CONCAT44(uStack_3c,uStack_40);
        (pmVar4->normal).y = (float)uStack_38;
        (pmVar4->normal).z = (float)uStack_34;
        pmVar4->index = local_4c;
        (pmVar4->offset).x = (float)uStack_48;
        (pmVar4->offset).y = (float)uStack_44;
        (pmVar4->offset).z = (float)uStack_40;
        this_01 = this->m_reader;
        iVar5 = (int)this_01->end;
        if (iVar5 == *(int *)&this_01->current) {
          bVar7 = false;
        }
        else {
          uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_01);
          uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar3;
          bVar7 = uVar2 != 0xc111;
          this_01 = this->m_reader;
          iVar5 = (int)this_01->end;
        }
        bVar6 = iVar5 == *(int *)&this_01->current;
      } while ((!bVar7) && (iVar5 != *(int *)&this_01->current));
    }
    if (!bVar6) {
      StreamReader<false,_false>::IncPtr(this_01,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadPoseVertices(Pose *pose)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_POSE_VERTEX)
        {
            Pose::Vertex v;
            v.index = Read<uint32_t>();
            ReadVector(v.offset);
            if (pose->hasNormals)
                ReadVector(v.normal);

            pose->vertices[v.index] = v;

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}